

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O3

bool __thiscall libtorrent::bdecode_node::has_soft_error(bdecode_node *this,span<char> error)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  char *__format;
  bool bVar6;
  int iVar7;
  bdecode_token *pbVar8;
  int iVar9;
  uint uVar10;
  bdecode_token bVar11;
  bdecode_token bVar12;
  int token;
  vector<int,_std::allocator<int>_> stack;
  int local_7c;
  vector<int,_std::allocator<int>_> local_78;
  bdecode_node *local_58;
  char *local_50;
  size_t local_48;
  bdecode_token *local_40;
  char *local_38;
  
  local_48 = error.m_len;
  local_50 = error.m_ptr;
  local_7c = this->m_token_idx;
  if (((long)local_7c == -1) ||
     (pbVar8 = this->m_root_tokens, (pbVar8[local_7c].field_0x3 & 0xe0) == 0)) {
    bVar6 = false;
  }
  else {
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (int *)0x0;
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (int *)0x0;
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    local_58 = this;
    std::vector<int,_std::allocator<int>_>::reserve(&local_78,100);
    do {
      iVar1 = local_7c;
      uVar5 = SUB84(pbVar8[local_7c],0);
      switch((uint)((ulong)pbVar8[local_7c] >> 0x1d) & 7) {
      case 1:
      case 2:
        if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_78,
                     (iterator)
                     local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_7c);
        }
        else {
          *local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = local_7c;
          local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        break;
      case 3:
        uVar4 = (ulong)(uVar5 & 0x1fffffff);
        if ((local_58->m_buffer[uVar4] == '0') && (local_58->m_buffer[uVar4 + 1] != ':')) {
          __format = "leading zero in string length";
LAB_0018c66c:
          snprintf(local_50,local_48,__format);
          bVar6 = true;
          goto LAB_0018c684;
        }
        break;
      case 4:
        uVar4 = (ulong)(uVar5 & 0x1fffffff);
        if ((local_58->m_buffer[uVar4 + 1] == '0') && (local_58->m_buffer[uVar4 + 2] != 'e')) {
          __format = "leading zero in integer";
          goto LAB_0018c66c;
        }
        break;
      case 5:
        iVar2 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish[-1];
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1;
        if ((((ulong)pbVar8[iVar2] & 0xe0000000) == 0x20000000) && (local_7c != iVar2 + 1)) {
          bVar11 = pbVar8[(long)iVar2 + 1];
          iVar2 = (bVar11._4_4_ & 0x1fffffff) + iVar2 + 1;
          bVar12 = pbVar8[iVar2];
          iVar2 = iVar2 + (bVar12._4_4_ & 0x1fffffff);
          if (iVar2 != local_7c) {
            local_38 = local_58->m_buffer;
            local_40 = pbVar8;
            do {
              uVar10 = (bVar11._4_4_ >> 0x1d) + (bVar11._0_4_ & 0x1fffffff);
              bVar11 = local_40[iVar2];
              iVar2 = iVar2 + (bVar11._4_4_ & 0x1fffffff);
              iVar9 = ((bVar12._0_4_ & 0x1fffffff) - uVar10) + -2;
              uVar5 = (bVar11._4_4_ >> 0x1d) + (bVar11._0_4_ & 0x1fffffff);
              bVar12 = local_40[iVar2];
              iVar7 = ((bVar12._0_4_ & 0x1fffffff) - uVar5) + -2;
              iVar3 = iVar9;
              if (iVar7 < iVar9) {
                iVar3 = iVar7;
              }
              iVar3 = memcmp(local_38 + (ulong)uVar10 + 2,local_38 + (ulong)uVar5 + 2,(long)iVar3);
              if (0 < iVar3) {
LAB_0018c64a:
                __format = "unsorted dictionary key";
                goto LAB_0018c66c;
              }
              if (iVar3 == 0) {
                if (iVar7 < iVar9) goto LAB_0018c64a;
                if (iVar7 == iVar9) {
                  __format = "duplicate dictionary key";
                  goto LAB_0018c66c;
                }
              }
              iVar2 = iVar2 + (bVar12._4_4_ & 0x1fffffff);
              pbVar8 = local_40;
            } while (iVar2 != iVar1);
          }
        }
      }
      local_7c = local_7c + 1;
    } while (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start !=
             local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
    bVar6 = false;
LAB_0018c684:
    if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return bVar6;
}

Assistant:

bdecode_node::type_t bdecode_node::type() const noexcept
	{
		if (m_token_idx == -1) return none_t;
		return static_cast<bdecode_node::type_t>(m_root_tokens[m_token_idx].type);
	}